

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_dictionary.cpp
# Opt level: O0

void duckdb_brotli::BrotliSharedDictionaryDestroyInstance(BrotliSharedDictionaryInternal *dict)

{
  code *pcVar1;
  undefined8 uVar2;
  long in_RDI;
  void *opaque;
  brotli_free_func free_func;
  
  if (in_RDI != 0) {
    pcVar1 = *(code **)(in_RDI + 0x570);
    uVar2 = *(undefined8 *)(in_RDI + 0x578);
    (*pcVar1)(uVar2,*(undefined8 *)(in_RDI + 0x548));
    (*pcVar1)(uVar2,*(undefined8 *)(in_RDI + 0x558));
    (*pcVar1)(uVar2,*(undefined8 *)(in_RDI + 0x560));
    (*pcVar1)(uVar2,in_RDI);
  }
  return;
}

Assistant:

void duckdb_brotli::BrotliSharedDictionaryDestroyInstance(
    BrotliSharedDictionary* dict) {
  if (!dict) {
    return;
  } else {
    brotli_free_func free_func = dict->free_func;
    void* opaque = dict->memory_manager_opaque;
    /* Cleanup. */
    free_func(opaque, dict->words_instances);
    free_func(opaque, dict->transforms_instances);
    free_func(opaque, dict->prefix_suffix_maps);
    /* Self-destruction. */
    free_func(opaque, dict);
  }
}